

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.c
# Opt level: O0

int resolve_unit_addrs_overlap_walk
              (backtrace_state *state,size_t *pfrom,size_t *pto,unit_addrs *enclosing,
              unit_addrs_vector *old_vec,backtrace_error_callback error_callback,void *data,
              unit_addrs_vector *new_vec)

{
  void *pvVar1;
  ulong uVar2;
  int iVar3;
  undefined8 *puVar4;
  void *pvVar5;
  long *plVar6;
  undefined8 *puVar7;
  unit_addrs *pa;
  size_t new_high;
  void *grew;
  size_t to;
  size_t from;
  unit_addrs *new_addrs;
  size_t old_count;
  unit_addrs *old_addrs;
  backtrace_error_callback error_callback_local;
  unit_addrs_vector *old_vec_local;
  unit_addrs *enclosing_local;
  size_t *pto_local;
  size_t *pfrom_local;
  backtrace_state *state_local;
  
  pvVar1 = (old_vec->vec).base;
  uVar2 = old_vec->count;
  from = (size_t)(new_vec->vec).base;
  to = *pfrom;
  grew = (void *)*pto;
  while( true ) {
    if (uVar2 <= to) {
      if (enclosing == (unit_addrs *)0x0) {
        plVar6 = (long *)tcmalloc_backtrace_vector_grow
                                   (state,0x18,error_callback,data,&new_vec->vec);
        if (plVar6 == (long *)0x0) {
          return 0;
        }
        *plVar6 = 0;
        *plVar6 = *plVar6 + -1;
        plVar6[1] = *plVar6;
        plVar6[2] = 0;
        new_vec->count = (size_t)grew;
      }
      return 1;
    }
    if ((enclosing != (unit_addrs *)0x0) &&
       (enclosing->high <= *(ulong *)((long)pvVar1 + to * 0x18))) break;
    puVar4 = (undefined8 *)(from + (long)grew * 0x18);
    puVar7 = (undefined8 *)((long)pvVar1 + to * 0x18);
    *puVar4 = *puVar7;
    puVar4[1] = puVar7[1];
    puVar4[2] = puVar7[2];
    if (((enclosing != (unit_addrs *)0x0) &&
        (*(ulong *)((long)pvVar1 + to * 0x18 + 8) < enclosing->high)) &&
       (*(ulong *)((long)pvVar1 + to * 0x18 + 8) < *(ulong *)((long)pvVar1 + (to + 1) * 0x18))) {
      pvVar5 = tcmalloc_backtrace_vector_grow(state,0x18,error_callback,data,&new_vec->vec);
      if (pvVar5 == (void *)0x0) {
        return 0;
      }
      from = (size_t)(new_vec->vec).base;
      grew = (void *)((long)grew + 1);
      *(undefined8 *)(from + (long)grew * 0x18) = *(undefined8 *)((long)pvVar1 + to * 0x18 + 8);
      pa = *(unit_addrs **)((long)pvVar1 + (to + 1) * 0x18);
      if ((unit_addrs *)enclosing->high < pa) {
        pa = (unit_addrs *)enclosing->high;
      }
      *(unit_addrs **)(from + (long)grew * 0x18 + 8) = pa;
      *(unit **)(from + (long)grew * 0x18 + 0x10) = enclosing->u;
    }
    if (*(ulong *)((long)pvVar1 + (to + 1) * 0x18 + 8) < *(ulong *)((long)pvVar1 + to * 0x18 + 8)) {
      *pfrom = to + 1;
      *pto = (long)grew + 1;
      iVar3 = resolve_unit_addrs_overlap_walk
                        (state,pfrom,pto,(unit_addrs *)((long)pvVar1 + to * 0x18),old_vec,
                         error_callback,data,new_vec);
      if (iVar3 == 0) {
        return 0;
      }
      to = *pfrom - 1;
      grew = (void *)(*pto - 1);
    }
    to = to + 1;
    grew = (void *)((long)grew + 1);
  }
  *pfrom = to;
  *pto = (size_t)grew;
  return 1;
}

Assistant:

static int
resolve_unit_addrs_overlap_walk (struct backtrace_state *state,
				 size_t *pfrom, size_t *pto,
				 struct unit_addrs *enclosing,
				 struct unit_addrs_vector *old_vec,
				 backtrace_error_callback error_callback,
				 void *data,
				 struct unit_addrs_vector *new_vec)
{
  struct unit_addrs *old_addrs;
  size_t old_count;
  struct unit_addrs *new_addrs;
  size_t from;
  size_t to;

  old_addrs = (struct unit_addrs *) old_vec->vec.base;
  old_count = old_vec->count;
  new_addrs = (struct unit_addrs *) new_vec->vec.base;

  for (from = *pfrom, to = *pto; from < old_count; from++, to++)
    {
      /* If we are in the scope of a larger range that can no longer
	 cover any further ranges, return back to the caller.  */

      if (enclosing != NULL
	  && enclosing->high <= old_addrs[from].low)
	{
	  *pfrom = from;
	  *pto = to;
	  return 1;
	}

      new_addrs[to] = old_addrs[from];

      /* If we are in scope of a larger range, fill in any gaps
	 between this entry and the next one.

	 There is an extra entry at the end of the vector, so it's
	 always OK to refer to from + 1.  */

      if (enclosing != NULL
	  && enclosing->high > old_addrs[from].high
	  && old_addrs[from].high < old_addrs[from + 1].low)
	{
	  void *grew;
	  size_t new_high;

	  grew = backtrace_vector_grow (state, sizeof (struct unit_addrs),
					error_callback, data, &new_vec->vec);
	  if (grew == NULL)
	    return 0;
	  new_addrs = (struct unit_addrs *) new_vec->vec.base;
	  to++;
	  new_addrs[to].low = old_addrs[from].high;
	  new_high = old_addrs[from + 1].low;
	  if (enclosing->high < new_high)
	    new_high = enclosing->high;
	  new_addrs[to].high = new_high;
	  new_addrs[to].u = enclosing->u;
	}

      /* If this range has a larger scope than the next one, use it to
	 fill in any gaps.  */

      if (old_addrs[from].high > old_addrs[from + 1].high)
	{
	  *pfrom = from + 1;
	  *pto = to + 1;
	  if (!resolve_unit_addrs_overlap_walk (state, pfrom, pto,
						&old_addrs[from], old_vec,
						error_callback, data, new_vec))
	    return 0;
	  from = *pfrom;
	  to = *pto;

	  /* Undo the increment the loop is about to do.  */
	  from--;
	  to--;
	}
    }

  if (enclosing == NULL)
    {
      struct unit_addrs *pa;

      /* Add trailing entry.  */

      pa = ((struct unit_addrs *)
	    backtrace_vector_grow (state, sizeof (struct unit_addrs),
				   error_callback, data, &new_vec->vec));
      if (pa == NULL)
	return 0;
      pa->low = 0;
      --pa->low;
      pa->high = pa->low;
      pa->u = NULL;

      new_vec->count = to;
    }

  return 1;
}